

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMS_ALGORITHM_DESCRIPTION_Unmarshal
                 (TPMS_ALGORITHM_DESCRIPTION *target,BYTE **buffer,INT32 *size)

{
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMS_ALGORITHM_DESCRIPTION *target_local;
  
  target_local._4_4_ = UINT16_Unmarshal(&target->alg,buffer,size);
  if (target_local._4_4_ == 0) {
    target_local._4_4_ = TPMA_ALGORITHM_Unmarshal(&target->attributes,buffer,size);
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMS_ALGORITHM_DESCRIPTION_Unmarshal(TPMS_ALGORITHM_DESCRIPTION *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM_ALG_ID_Unmarshal((TPM_ALG_ID *)&(target->alg), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMA_ALGORITHM_Unmarshal((TPMA_ALGORITHM *)&(target->attributes), buffer, size);
    return result;
}